

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR moveto_union(lyxp_set *set1,lyxp_set *set2)

{
  uint uVar1;
  ly_ctx *ctx;
  lyd_node_inner *plVar2;
  lyd_node_inner *plVar3;
  int iVar4;
  LY_ERR LVar5;
  char *pcVar6;
  char *pcVar7;
  lyxp_set_node *plVar8;
  ulong uVar9;
  lyd_node_inner *plVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  int local_40;
  uint local_3c;
  
  if ((set1->type == LYXP_SET_NODE_SET) && (set2->type == LYXP_SET_NODE_SET)) {
    LVar5 = LY_SUCCESS;
    if (set2->used != 0) {
      if (set1->used == 0) {
        lyxp_set_free_content(set1);
        memcpy(set1,set2,0x90);
        LVar5 = LY_SUCCESS;
        memset(set2,0,0x90);
      }
      else {
        iVar4 = set_sort(set1);
        if ((iVar4 != 0) || (iVar4 = set_sort(set2), iVar4 != 0)) {
          __assert_fail("!set_sort(set1) && !set_sort(set2)",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x1bee,"LY_ERR moveto_union(struct lyxp_set *, struct lyxp_set *)");
        }
        LVar5 = LY_EINVAL;
        if ((set1->type == LYXP_SET_NODE_SET) && (set2->type == LYXP_SET_NODE_SET)) {
          if (set2->used != 0) {
            if (set1->used != 0) {
              plVar10 = (lyd_node_inner *)set1->tree;
              do {
                plVar2 = (plVar10->field_0).node.parent;
                plVar3 = plVar10;
                plVar10 = plVar2;
              } while (plVar2 != (lyd_node_inner *)0x0);
              do {
                plVar10 = plVar3;
                plVar3 = (lyd_node_inner *)(plVar10->field_0).node.prev;
              } while ((plVar3->field_0).node.next != (lyd_node *)0x0);
              LVar5 = set_assign_pos(set1,(lyd_node *)plVar10,set1->root_type);
              if (LVar5 != LY_SUCCESS) {
                return LY_EINT;
              }
              LVar5 = set_assign_pos(set2,(lyd_node *)plVar10,set2->root_type);
              if (LVar5 != LY_SUCCESS) {
                return LY_EINT;
              }
              local_3c = 0;
              ly_log_dbg(2,"MERGE target");
              print_set_debug(set1);
              ly_log_dbg(2,"MERGE source");
              print_set_debug(set2);
              if (set1->size - set1->used < set2->used) {
                uVar12 = set2->used + set1->used;
                set1->size = uVar12;
                plVar8 = (lyxp_set_node *)ly_realloc((set1->val).nodes,(ulong)uVar12 << 4);
                (set1->val).nodes = plVar8;
                if (plVar8 == (lyxp_set_node *)0x0) {
                  ly_log(set2->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "set_sorted_merge");
                  return LY_EMEM;
                }
              }
              uVar9 = 0;
              uVar12 = 0;
              local_40 = 0;
LAB_001a0199:
              iVar4 = set_sort_compare((set2->val).nodes + local_3c,(set1->val).nodes + uVar9);
              if (iVar4 == 0) {
                if (uVar12 != 0) {
                  uVar12 = uVar12 + 1;
                  local_40 = local_40 + 1;
                  local_3c = local_3c + 1;
                  uVar9 = (ulong)((int)uVar9 + 1);
                  goto LAB_001a021f;
                }
                local_3c = local_3c + 1;
              }
              else {
                if (iVar4 < 0) {
                  uVar12 = uVar12 + 1;
                  set_insert_node_hash
                            (set1,(set2->val).nodes[local_3c].node,(set2->val).nodes[local_3c].type)
                  ;
                  local_3c = local_3c + 1;
                  goto LAB_001a021f;
                }
                uVar11 = uVar9;
                if (uVar12 != 0) goto LAB_001a0292;
              }
              uVar9 = (ulong)((int)uVar9 + 1);
              uVar12 = 0;
LAB_001a021f:
              do {
                uVar1 = set2->used;
                if (local_3c < uVar1) {
                  if ((uint)uVar9 < set1->used) goto LAB_001a0199;
                }
                else if (uVar12 == 0) {
                  if ((set1->ht == (ly_ht *)0x0) && (3 < set1->used)) {
                    set_insert_node_hash(set1,(lyd_node *)0x0,LYXP_NODE_NONE);
                  }
                  ly_log_dbg(2,"MERGE result");
                  print_set_debug(set1);
                  goto LAB_001a034e;
                }
                uVar13 = (ulong)local_3c;
                uVar11 = uVar13 << 4 | 8;
                for (; uVar13 < uVar1; uVar13 = uVar13 + 1) {
                  set_insert_node_hash
                            (set1,*(lyd_node **)((long)(set2->val).nodes + (uVar11 - 8)),
                             *(lyxp_node_type *)((long)&((set2->val).nodes)->node + uVar11));
                  uVar1 = set2->used;
                  uVar11 = uVar11 + 0x10;
                }
                uVar12 = (uVar12 - local_3c) + uVar1;
                uVar11 = uVar9;
                local_3c = uVar1;
LAB_001a0292:
                iVar4 = (int)uVar11;
                uVar9 = (ulong)((uVar12 - local_40) + iVar4);
                memmove((set1->val).nodes + uVar9,(set1->val).nodes + uVar11,
                        (ulong)(set1->used - iVar4) << 4);
                memcpy((set1->val).nodes + (uint)(iVar4 - local_40),
                       (set2->val).nodes + (local_3c - uVar12),(ulong)uVar12 << 4);
                set1->used = set1->used + (uVar12 - local_40);
                uVar12 = 0;
                local_40 = 0;
              } while( true );
            }
            set_fill_set(set1,set2);
LAB_001a034e:
            lyxp_set_free_content(set2);
          }
          iVar4 = set_sort(set1);
          LVar5 = LY_SUCCESS;
          if (iVar4 != 0) {
            __assert_fail("!set_sort(set1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                          ,0x1bf5,"LY_ERR moveto_union(struct lyxp_set *, struct lyxp_set *)");
          }
        }
      }
    }
  }
  else {
    ctx = set1->ctx;
    pcVar6 = print_set_type(set1);
    pcVar7 = print_set_type(set2);
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s and %s.","union",
            pcVar6,pcVar7);
    LVar5 = LY_EVALID;
  }
  return LVar5;
}

Assistant:

static LY_ERR
moveto_union(struct lyxp_set *set1, struct lyxp_set *set2)
{
    LY_ERR rc;

    if ((set1->type != LYXP_SET_NODE_SET) || (set2->type != LYXP_SET_NODE_SET)) {
        LOGVAL(set1->ctx, LY_VCODE_XP_INOP_2, "union", print_set_type(set1), print_set_type(set2));
        return LY_EVALID;
    }

    /* set2 is empty or both set1 and set2 */
    if (!set2->used) {
        return LY_SUCCESS;
    }

    if (!set1->used) {
        /* release hidden allocated data (lyxp_set.size) */
        lyxp_set_free_content(set1);
        /* direct copying of the entire structure */
        memcpy(set1, set2, sizeof *set1);
        /* dynamic memory belongs to set1 now, do not free */
        memset(set2, 0, sizeof *set2);
        return LY_SUCCESS;
    }

    /* we assume sets are sorted */
    assert(!set_sort(set1) && !set_sort(set2));

    /* sort, remove duplicates */
    rc = set_sorted_merge(set1, set2);
    LY_CHECK_RET(rc);

    /* final set must be sorted */
    assert(!set_sort(set1));

    return LY_SUCCESS;
}